

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFileCreation.cpp
# Opt level: O2

LinkedObjectFile *
to_linked_object_file
          (LinkedObjectFile *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *data,string *name)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  byte bVar4;
  value_type vVar5;
  short sVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  uint32_t uVar10;
  int *piVar11;
  const_reference pvVar12;
  uint32_t *puVar13;
  Config *pCVar14;
  uint32_t *puVar15;
  byte *pbVar16;
  uint *puVar17;
  ushort *puVar18;
  size_t sVar19;
  TypeInfo *pTVar20;
  int *piVar21;
  const_reference pvVar22;
  long lVar23;
  int iVar24;
  uint uVar25;
  uint dest_segment;
  ulong uVar26;
  uint32_t *x_2;
  int *piVar27;
  ulong uVar28;
  Kind kind;
  SymbolLinkKind SVar29;
  uint uVar30;
  uint uVar31;
  size_type sVar32;
  uint uVar33;
  int iVar34;
  uint8_t *x_1;
  byte bVar35;
  uint32_t *x;
  allocator local_c1;
  LinkedObjectFile *local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_b8;
  const_reference local_b0;
  int *local_a8;
  int *local_a0;
  ulong local_98;
  string *local_90;
  uint32_t segment_link_offsets [3];
  uint32_t segment_data_offsets [3];
  uint32_t segment_link_ends [3];
  string local_50;
  
  *(undefined1 (*) [16])&(__return_storage_ptr__->stats).decoded_ops = (undefined1  [16])0x0;
  (__return_storage_ptr__->stats).data_bytes = 0;
  (__return_storage_ptr__->stats).code_bytes = 0;
  (__return_storage_ptr__->stats).function_count = 0;
  (__return_storage_ptr__->stats).decoded_ops = 0;
  (__return_storage_ptr__->stats).v3_link_bytes = 0;
  (__return_storage_ptr__->stats).v3_symbol_count = 0;
  (__return_storage_ptr__->stats).v3_symbol_link_offset = 0;
  (__return_storage_ptr__->stats).v3_symbol_link_word = 0;
  (__return_storage_ptr__->stats).v3_pointers = 0;
  (__return_storage_ptr__->stats).v3_split_pointers = 0;
  (__return_storage_ptr__->stats).v3_word_pointers = 0;
  (__return_storage_ptr__->stats).v3_pointer_seeks = 0;
  (__return_storage_ptr__->stats).total_v2_link_bytes = 0;
  (__return_storage_ptr__->stats).total_v2_symbol_links = 0;
  (__return_storage_ptr__->stats).total_v2_symbol_count = 0;
  (__return_storage_ptr__->stats).v3_code_bytes = 0;
  (__return_storage_ptr__->stats).total_code_bytes = 0;
  (__return_storage_ptr__->stats).total_v2_code_bytes = 0;
  (__return_storage_ptr__->stats).total_v2_pointers = 0;
  (__return_storage_ptr__->stats).total_v2_pointer_seeks = 0;
  (__return_storage_ptr__->words_by_seg).
  super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->words_by_seg).
  super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(__return_storage_ptr__->words_by_seg).
    super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (__return_storage_ptr__->offset_of_data_zone_by_seg).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->offset_of_data_zone_by_seg).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->functions_by_seg).
  super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->functions_by_seg).
  super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(__return_storage_ptr__->functions_by_seg).
    super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (__return_storage_ptr__->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->label_per_seg_by_offset).
  super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->label_per_seg_by_offset).
  super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->label_per_seg_by_offset).
  super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = __return_storage_ptr__;
  local_90 = name;
  piVar11 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,0);
  sVar6 = (short)piVar11[2];
  local_b8 = data;
  if (sVar6 == 5) {
    piVar11 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,0);
    if ((char)piVar11[5] == '\x01') {
      printf("abandon %s!\n",(local_90->_M_dataplus)._M_p);
      return local_c0;
    }
    if (*piVar11 != 0) {
      __assert_fail("header->type_tag == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                    ,0x18a,
                    "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                   );
    }
    bVar8 = std::operator==(local_90,(char *)((long)piVar11 + 0x15));
    if (!bVar8) {
      __assert_fail("name == header->name",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                    ,0x18b,
                    "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                   );
    }
    if ((char)piVar11[5] != '\x03') {
      __assert_fail("header->n_segments == 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                    ,0x18c,
                    "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                   );
    }
    if (piVar11[3] != 0x50) {
      __assert_fail("header->pad == 0x50",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                    ,0x18d,
                    "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                   );
    }
    if (piVar11[1] - piVar11[4] != 0x50) {
      __assert_fail("header->length_to_get_to_code - header->link_length == 0x50",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                    ,0x18e,
                    "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                   );
    }
    LinkedObjectFile::set_segment_count(local_c0,3);
    iVar34 = piVar11[1];
    piVar27 = piVar11 + 0x14;
    lVar23 = 0;
    while (lVar23 != 0xc) {
      *(int *)((long)segment_data_offsets + lVar23) = piVar11[lVar23 + 0x15] + iVar34;
      *(int *)((long)segment_link_offsets + lVar23) = piVar27[lVar23] + 0x50;
      lVar1 = lVar23 + 0x17;
      lVar23 = lVar23 + 4;
      if (piVar11[lVar1] != 1) {
        __assert_fail("header->segment_info[i].magic == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x1a6,
                      "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                     );
      }
    }
    lVar23 = 0;
    while (lVar23 != 8) {
      piVar21 = (int *)((long)segment_data_offsets + lVar23);
      lVar1 = lVar23 + 0x16;
      lVar7 = lVar23 + 4;
      lVar23 = lVar23 + 4;
      if ((*piVar21 + piVar11[lVar1] + 0xfU & 0xfffffff0) !=
          *(uint *)((long)segment_data_offsets + lVar7)) {
        __assert_fail("align16(segment_data_offsets[i] + header->segment_info[i].size) == segment_data_offsets[i + 1]"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x1ac,
                      "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                     );
      }
    }
    if ((long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start !=
        (ulong)(segment_data_offsets[2] + piVar11[0x1e] + 0xf & 0xfffffff0)) {
      __assert_fail("align16(segment_data_offsets[2] + header->segment_info[2].size) == data.size()"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                    ,0x1ae,
                    "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                   );
    }
    pvVar12 = (const_reference)0x3;
    local_a0 = piVar27;
    while( true ) {
      do {
        bVar8 = pvVar12 == (const_reference)0x0;
        pvVar12 = (const_reference)((long)pvVar12 - 1);
        if (bVar8) {
          if (segment_link_offsets[0] != 0x80) {
            __assert_fail("segment_link_offsets[0] == 128",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,0x23b,
                          "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                         );
          }
          if (piVar11[0x16] == 0) {
            uVar10 = 0x82;
            if (segment_link_offsets[1] != 0x82) {
              __assert_fail("segment_link_offsets[0] + 2 == segment_link_offsets[1]",
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                            ,0x240,
                            "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                           );
            }
          }
          else {
            uVar10 = segment_link_ends[0] + 1;
            if (uVar10 != segment_link_offsets[1]) {
              __assert_fail("segment_link_ends[0] + 1 == segment_link_offsets[1]",
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                            ,0x23e,
                            "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                           );
            }
          }
          if (piVar11[0x1a] == 0) {
            if (uVar10 + 2 != segment_link_offsets[2]) {
              __assert_fail("segment_link_offsets[1] + 2 == segment_link_offsets[2]",
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                            ,0x246,
                            "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                           );
            }
          }
          else if (segment_link_ends[1] + 1 != segment_link_offsets[2]) {
            __assert_fail("segment_link_ends[1] + 1 == segment_link_offsets[2]",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,0x244,
                          "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                         );
          }
          if ((segment_link_ends[2] + 0x11 & 0xfffffff0) == segment_data_offsets[0]) {
            return local_c0;
          }
          __assert_fail("align16(segment_link_ends[2] + 2) == segment_data_offsets[0]",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                        ,0x249,
                        "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                       );
        }
        uVar25 = piVar27[(long)pvVar12 * 4 + 2];
      } while (uVar25 == 0);
      puVar15 = &(local_c0->stats).v3_code_bytes;
      *puVar15 = *puVar15 + uVar25;
      uVar31 = uVar25;
      bVar8 = false;
      do {
        bVar9 = bVar8;
        uVar33 = uVar31 & 3;
        uVar31 = uVar31 + 1;
        bVar8 = true;
      } while (uVar33 != 0);
      local_b0 = pvVar12;
      if (bVar9) {
        printf("Adjusted the size of segment %d in %s, this is fine, but rare (and may indicate a bigger problem if it happens often)\n"
               ,pvVar12,(local_90->_M_dataplus)._M_p);
      }
      uVar31 = segment_data_offsets[(long)local_b0];
      if ((uVar31 & 3) != 0) {
        __assert_fail("(data_ptr % 4) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x1cc,
                      "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                     );
      }
      uVar33 = segment_link_offsets[(long)local_b0];
      sVar32 = (size_type)uVar33;
      puVar15 = (uint32_t *)
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,(ulong)uVar31);
      uVar28 = (ulong)(uVar31 - 4);
      pvVar22 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                          (data,(ulong)((-uVar25 & 3) + uVar25 + (uVar31 - 4)));
      pvVar12 = local_b0;
      for (; puVar15 < pvVar22 + 4; puVar15 = puVar15 + 1) {
        LinkedObjectFile::push_back_word_to_segment(local_c0,*puVar15,(int)pvVar12);
      }
      pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,sVar32);
      if (*pvVar12 != '\0') break;
LAB_00138e1c:
      uVar10 = uVar33 + 1;
      sVar32 = (size_type)uVar10;
      pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,sVar32);
      vVar5 = *pvVar12;
      pvVar12 = local_b0;
      piVar27 = local_a0;
      while (local_b0 = pvVar12, local_a0 = piVar27, vVar5 != '\0') {
        iVar34 = (int)sVar32;
        pbVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,sVar32);
        if ((char)*pbVar16 < '\0') {
          if ((~*pbVar16 & 0x3f) == 0) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,0x225,
                          "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                         );
          }
          pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              (data,(ulong)(iVar34 + 3));
          sVar19 = strlen((char *)pvVar12);
          iVar24 = (int)sVar19;
          SVar29 = TYPE;
        }
        else {
          pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              (data,(ulong)(iVar34 + 3));
          sVar19 = strlen((char *)pvVar12);
          std::__cxx11::string::string((string *)&local_50,"_empty_",&local_c1);
          iVar24 = (int)sVar19;
          bVar8 = std::operator==(&local_50,(char *)pvVar12);
          std::__cxx11::string::~string((string *)&local_50);
          SVar29 = (uint)!bVar8 * 2;
        }
        uVar10 = c_symlink2(local_c0,data,uVar31,iVar24 + iVar34 + 4,SVar29,(char *)pvVar12,
                            (int)local_b0);
        sVar32 = (size_type)uVar10;
        pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,(ulong)uVar10)
        ;
        vVar5 = *pvVar12;
        pvVar12 = local_b0;
        piVar27 = local_a0;
      }
      segment_link_ends[(long)pvVar12] = uVar10;
    }
    local_98 = (ulong)-uVar31;
    uVar26 = 0;
    do {
      if ((uVar26 & 1) == 0) {
        pbVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,sVar32);
        uVar28 = (ulong)((int)uVar28 + (uint)*pbVar16 * 4);
        puVar15 = &(local_c0->stats).v3_pointer_seeks;
        *puVar15 = *puVar15 + 1;
      }
      else {
        local_a8 = (int *)CONCAT44(local_a8._4_4_,(int)uVar26);
        for (uVar25 = 0;
            pbVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                (local_b8,sVar32), uVar25 < *pbVar16; uVar25 = uVar25 + 1) {
          puVar15 = &(local_c0->stats).v3_pointers;
          *puVar15 = *puVar15 + 1;
          iVar34 = (int)uVar28;
          puVar17 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                      (local_b8,uVar28);
          uVar33 = *puVar17;
          if (uVar33 < 0x1000000) {
            puVar15 = &(local_c0->stats).v3_word_pointers;
            *puVar15 = *puVar15 + 1;
            bVar8 = LinkedObjectFile::pointer_link_word
                              (local_c0,(int)local_b0,(int)local_98 + iVar34,(int)local_b0,uVar33);
            if (!bVar8) {
              printf("WARNING bad pointer_link_word (2) in %s\n",(local_90->_M_dataplus)._M_p);
            }
          }
          else {
            puVar15 = &(local_c0->stats).v3_split_pointers;
            *puVar15 = *puVar15 + 1;
            uVar30 = uVar33 >> 0xc & 0xf;
            if (uVar30 == 0) {
              __assert_fail("lo_hi_offset",
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                            ,0x1ec,
                            "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                           );
            }
            dest_segment = uVar33 >> 8 & 0xf;
            if (2 < dest_segment) {
              __assert_fail("dest_seg < 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                            ,0x1ed,
                            "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                           );
            }
            puVar18 = (ushort *)
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                (local_b8,(ulong)(iVar34 + uVar30 * 4));
            iVar24 = (int)local_98 + iVar34;
            LinkedObjectFile::pointer_link_split_word
                      (local_c0,(int)local_b0,iVar24,uVar30 * 4 + iVar24,dest_segment,
                       (uVar33 & 0xff) << 0x10 | (uint)*puVar18);
          }
          uVar28 = (ulong)(iVar34 + 4);
        }
        uVar26 = (ulong)local_a8 & 0xffffffff;
        data = local_b8;
      }
      pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,sVar32);
      iVar34 = (int)sVar32;
      uVar33 = iVar34 + 1;
      sVar32 = (size_type)uVar33;
      if (*pvVar12 == 0xff) {
        pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,sVar32);
        bVar8 = *pvVar12 == '\0';
        if (bVar8) {
          sVar32 = (size_type)(iVar34 + 2);
        }
      }
      else {
        pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,sVar32);
        bVar8 = true;
        if (*pvVar12 == '\0') goto LAB_00138e1c;
      }
      uVar26 = CONCAT71((int7)(uVar26 >> 8),(byte)uVar26 ^ bVar8);
    } while( true );
  }
  if (sVar6 != 4) {
    if (sVar6 != 3) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                    ,0x319,
                    "LinkedObjectFile to_linked_object_file(const std::vector<uint8_t> &, const std::string &)"
                   );
    }
    if (*piVar11 != 0) {
      __assert_fail("header->type_tag == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                    ,0x311,
                    "LinkedObjectFile to_linked_object_file(const std::vector<uint8_t> &, const std::string &)"
                   );
    }
    pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,0);
    local_a0 = (int *)pvVar12;
    bVar8 = std::operator==(local_90,(char *)(pvVar12 + 0x10));
    if (!bVar8) {
      __assert_fail("name == header->name",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                    ,0x250,
                    "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                   );
    }
    if (*(int *)(pvVar12 + 0xc) != 3) {
      __assert_fail("header->segments == 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                    ,0x251,
                    "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                   );
    }
    LinkedObjectFile::set_segment_count(local_c0,3);
    piVar11 = local_a0;
    lVar23 = -1;
    do {
      lVar1 = lVar23 + 0x11;
      lVar23 = lVar23 + 1;
    } while (pvVar12[lVar1] != '\0');
    while (lVar23 < 0x40) {
      lVar1 = lVar23 + 0x10;
      lVar23 = lVar23 + 1;
      if (*(const_reference)((long)local_a0 + lVar1) != '\0') {
        __assert_fail("!*ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x17d,"void assert_string_empty_after(const char *, int)");
      }
    }
    lVar23 = 0;
    while (lVar23 + 0x10 != 0x40) {
      lVar1 = lVar23 + 0x5c;
      lVar23 = lVar23 + 0x10;
      if (*(int *)((long)local_a0 + lVar1) != 0) {
        __assert_fail("header->segment_info[i].magic == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,599,
                      "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                     );
      }
    }
    iVar34 = *(int *)((long)local_a0 + 4);
    puVar15 = &(local_c0->stats).v3_link_bytes;
    *puVar15 = *puVar15 + iVar34;
    for (lVar23 = 0; lVar23 != 0xc; lVar23 = lVar23 + 4) {
      *(int *)((long)segment_data_offsets + lVar23) =
           *(int *)((long)local_a0 + lVar23 * 4 + 0x54) + iVar34;
      *(undefined4 *)((long)segment_link_offsets + lVar23) =
           *(undefined4 *)((long)local_a0 + lVar23 * 4 + 0x50);
    }
    lVar23 = 0;
    while (lVar23 != 8) {
      piVar27 = (int *)((long)segment_data_offsets + lVar23);
      lVar1 = lVar23 * 4;
      lVar7 = lVar23 + 4;
      lVar23 = lVar23 + 4;
      if ((*piVar27 + *(int *)((long)local_a0 + lVar1 + 0x58) + 0xfU & 0xfffffff0) !=
          *(uint *)((long)segment_data_offsets + lVar7)) {
        __assert_fail("align16(segment_data_offsets[i] + header->segment_info[i].size) == segment_data_offsets[i + 1]"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x26b,
                      "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                     );
      }
    }
    pvVar12 = (const_reference)3;
    if ((long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start !=
        (ulong)(segment_data_offsets[2] + *(int *)((long)local_a0 + 0x78) + 0xf & 0xfffffff0)) {
      __assert_fail("align16(segment_data_offsets[2] + header->segment_info[2].size) == data.size()"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                    ,0x26d,
                    "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                   );
    }
    while( true ) {
      do {
        uVar28 = (long)pvVar12 - 1;
        if (pvVar12 == (const_reference)0x0) {
          if (segment_link_offsets[0] != 0x80) {
            __assert_fail("segment_link_offsets[0] == 128",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,0x2f7,
                          "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                         );
          }
          if (*(int *)((long)local_a0 + 0x58) == 0) {
            uVar10 = 0x82;
            if (segment_link_offsets[1] != 0x82) {
              __assert_fail("segment_link_offsets[0] + 2 == segment_link_offsets[1]",
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                            ,0x2fc,
                            "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                           );
            }
          }
          else {
            uVar10 = segment_link_ends[0] + 1;
            if (uVar10 != segment_link_offsets[1]) {
              __assert_fail("segment_link_ends[0] + 1 == segment_link_offsets[1]",
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                            ,0x2fa,
                            "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                           );
            }
          }
          if (*(int *)((long)local_a0 + 0x68) == 0) {
            if (uVar10 + 2 != segment_link_offsets[2]) {
              __assert_fail("segment_link_offsets[1] + 2 == segment_link_offsets[2]",
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                            ,0x302,
                            "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                           );
            }
          }
          else if (segment_link_ends[1] + 1 != segment_link_offsets[2]) {
            __assert_fail("segment_link_ends[1] + 1 == segment_link_offsets[2]",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,0x300,
                          "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                         );
          }
          if ((segment_link_ends[2] + 0x11 & 0xfffffff0) == segment_data_offsets[0]) {
            return local_c0;
          }
          __assert_fail("align16(segment_link_ends[2] + 2) == segment_data_offsets[0]",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                        ,0x305,
                        "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                       );
        }
        uVar25 = *(uint *)((long)piVar11 + uVar28 * 0x10 + 0x58);
        pvVar12 = (const_reference)uVar28;
      } while (uVar25 == 0);
      puVar15 = &(local_c0->stats).v3_code_bytes;
      *puVar15 = *puVar15 + uVar25;
      local_b0 = (const_reference)uVar28;
      pCVar14 = get_config();
      if (pCVar14->game_version == 1) {
        bVar8 = std::operator==(local_90,"level-h");
        uVar25 = uVar25 + (local_b0 == (const_reference)0x0 && bVar8);
      }
      pCVar14 = get_config();
      pvVar12 = local_b0;
      if (pCVar14->game_version == 2) {
        uVar31 = uVar25;
        bVar8 = false;
        do {
          bVar9 = bVar8;
          uVar33 = uVar31 & 3;
          uVar31 = uVar31 + 1;
          bVar8 = true;
        } while (uVar33 != 0);
        uVar25 = (-uVar25 & 3) + uVar25;
        if (bVar9) {
          printf("Adjusted the size of segment %d in %s, this is fine, but rare (and may indicate a bigger problem if it happens often)\n"
                 ,(ulong)local_b0 & 0xffffffff,(local_90->_M_dataplus)._M_p);
        }
      }
      local_98 = (ulong)segment_data_offsets[(long)pvVar12];
      if ((segment_data_offsets[(long)pvVar12] & 3) != 0) {
        __assert_fail("(data_ptr % 4) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x294,
                      "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                     );
      }
      if ((uVar25 & 3) != 0) {
        __assert_fail("(segment_size % 4) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x295,
                      "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                     );
      }
      uVar31 = segment_link_offsets[(long)pvVar12];
      sVar32 = (size_type)uVar31;
      puVar15 = (uint32_t *)
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,local_98);
      uVar33 = (int)local_98 - 4;
      uVar28 = (ulong)uVar33;
      pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                          (data,(ulong)(uVar25 + uVar33));
      for (; puVar15 < pvVar12 + 4; puVar15 = puVar15 + 1) {
        LinkedObjectFile::push_back_word_to_segment(local_c0,*puVar15,(int)local_b0);
      }
      pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,sVar32);
      if (*pvVar12 != '\0') break;
LAB_00138806:
      uVar31 = uVar31 + 1;
LAB_00138809:
      uVar28 = (ulong)uVar31;
      pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,uVar28);
      if (*pvVar12 != '\0') {
        pbVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(local_b8,uVar28);
        bVar4 = *pbVar16;
        if ((char)bVar4 < '\0') {
          uVar31 = uVar31 + 1;
          pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              (local_b8,(ulong)uVar31);
          pTVar20 = get_type_info();
          local_a8 = (int *)pvVar12;
          std::__cxx11::string::string((string *)&local_50,(char *)pvVar12,&local_c1);
          TypeInfo::inform_type_method_count(pTVar20,&local_50,bVar4 & 0x7f);
          std::__cxx11::string::~string((string *)&local_50);
          iVar34 = 1;
        }
        else {
          local_a8 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                      (local_b8,uVar28);
          iVar34 = 2;
        }
        std::__cxx11::string::string((string *)&local_50,"_empty_",&local_c1);
        bVar8 = std::operator==(&local_50,(char *)local_a8);
        std::__cxx11::string::~string((string *)&local_50);
        piVar27 = local_a8;
        if (bVar8) {
          iVar34 = 0;
        }
        if (((char)bVar4 < '\0') && (bVar8)) {
          __assert_fail("kind == SymbolLinkKind::SYMBOL",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                        ,0x2ec,
                        "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                       );
        }
        sVar19 = strlen((char *)local_a8);
        puVar15 = &(local_c0->stats).v3_symbol_count;
        *puVar15 = *puVar15 + 1;
        pTVar20 = get_type_info();
        std::__cxx11::string::string((string *)&local_50,(char *)piVar27,&local_c1);
        TypeInfo::inform_symbol_with_no_type_info(pTVar20,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        data = local_b8;
        uVar31 = uVar31 + (int)sVar19 + 3;
        piVar27 = local_a8;
        uVar28 = local_98;
        do {
          pbVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              (data,(ulong)(uVar31 - 2));
          uVar25 = (int)uVar28 + (uint)*pbVar16 * 4;
          uVar28 = (ulong)uVar25;
          if (*pbVar16 != 0xff) {
            piVar21 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                       (data,uVar28);
            if (*piVar21 == -1) {
              puVar15 = &(local_c0->stats).v3_symbol_link_word;
              *puVar15 = *puVar15 + 1;
              if (iVar34 == 0) {
                kind = EMPTY_PTR;
              }
              else {
                kind = SYM_PTR;
                if (iVar34 == 1) {
                  pTVar20 = get_type_info();
                  std::__cxx11::string::string((string *)&local_50,(char *)piVar27,&local_c1);
                  TypeInfo::inform_type(pTVar20,&local_50);
                  std::__cxx11::string::~string((string *)&local_50);
                  kind = TYPE_PTR;
                  piVar27 = local_a8;
                }
              }
              LinkedObjectFile::symbol_link_word
                        (local_c0,(int)local_b0,uVar25 - (int)local_98,(char *)piVar27,kind);
            }
            else {
              puVar15 = &(local_c0->stats).v3_symbol_link_offset;
              *puVar15 = *puVar15 + 1;
              if (iVar34 != 2) {
                __assert_fail("kind == SymbolLinkKind::SYMBOL",
                              "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                              ,200,
                              "uint32_t c_symlink3(LinkedObjectFile &, const std::vector<uint8_t> &, uint32_t, uint32_t, SymbolLinkKind, const char *, int)"
                             );
              }
              LinkedObjectFile::symbol_link_offset
                        (local_c0,(int)local_b0,uVar25 - (int)local_98,(char *)piVar27);
            }
            pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                (data,(ulong)(uVar31 - 1));
            if (*pvVar12 == '\0') goto LAB_00138809;
          }
          uVar31 = uVar31 + 1;
        } while( true );
      }
      segment_link_ends[(long)local_b0] = uVar31;
      pvVar12 = local_b0;
      data = local_b8;
    }
    local_a8 = (int *)(ulong)(uint)-(int)local_98;
    bVar8 = false;
    do {
      if (bVar8) {
        for (uVar25 = 0;
            pbVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                (local_b8,sVar32), data = local_b8, uVar25 < *pbVar16;
            uVar25 = uVar25 + 1) {
          puVar15 = &(local_c0->stats).v3_pointers;
          *puVar15 = *puVar15 + 1;
          iVar34 = (int)uVar28;
          puVar17 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                      (local_b8,uVar28);
          uVar31 = *puVar17;
          if (uVar31 < 0x1000000) {
            puVar15 = &(local_c0->stats).v3_word_pointers;
            *puVar15 = *puVar15 + 1;
            bVar9 = LinkedObjectFile::pointer_link_word
                              (local_c0,(int)local_b0,(int)local_a8 + iVar34,(int)local_b0,uVar31);
            if (!bVar9) {
              printf("WARNING bad pointer_link_word (2) in %s\n",(local_90->_M_dataplus)._M_p);
            }
          }
          else {
            puVar15 = &(local_c0->stats).v3_split_pointers;
            *puVar15 = *puVar15 + 1;
            uVar33 = uVar31 >> 0xc & 0xf;
            if (uVar33 == 0) {
              __assert_fail("lo_hi_offset",
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                            ,0x2b4,
                            "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                           );
            }
            uVar30 = uVar31 >> 8 & 0xf;
            if (2 < uVar30) {
              __assert_fail("dest_seg < 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                            ,0x2b5,
                            "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                           );
            }
            puVar18 = (ushort *)
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                (local_b8,(ulong)(iVar34 + uVar33 * 4));
            iVar24 = (int)local_a8 + iVar34;
            LinkedObjectFile::pointer_link_split_word
                      (local_c0,(int)local_b0,iVar24,uVar33 * 4 + iVar24,uVar30,
                       (uVar31 & 0xff) << 0x10 | (uint)*puVar18);
          }
          uVar28 = (ulong)(iVar34 + 4);
        }
      }
      else {
        pbVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,sVar32);
        uVar28 = (ulong)((int)uVar28 + (uint)*pbVar16 * 4);
        puVar15 = &(local_c0->stats).v3_pointer_seeks;
        *puVar15 = *puVar15 + 1;
      }
      pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,sVar32);
      iVar34 = (int)sVar32;
      uVar31 = iVar34 + 1;
      sVar32 = (size_type)uVar31;
      if (*pvVar12 == 0xff) {
        pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,sVar32);
        bVar9 = *pvVar12 == '\0';
        if (bVar9) {
          sVar32 = (size_type)(iVar34 + 2);
        }
      }
      else {
        pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,sVar32);
        bVar9 = true;
        if (*pvVar12 == '\0') goto LAB_00138806;
      }
      bVar8 = (bool)(bVar8 ^ bVar9);
    } while( true );
  }
  if (*piVar11 != -1) {
    __assert_fail("header->type_tag == 0xffffffff",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                  ,0x314,
                  "LinkedObjectFile to_linked_object_file(const std::vector<uint8_t> &, const std::string &)"
                 );
  }
  local_b0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,0);
  iVar34 = *(int *)(local_b0 + 0xc);
  uVar2 = (local_c0->stats).total_code_bytes;
  uVar3 = (local_c0->stats).total_v2_code_bytes;
  (local_c0->stats).total_code_bytes = iVar34 + uVar2;
  (local_c0->stats).total_v2_code_bytes = iVar34 + uVar3;
  puVar15 = (uint32_t *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,0x10);
  uVar25 = iVar34 + 0x10;
  local_98 = CONCAT44(local_98._4_4_,uVar25);
  puVar13 = (uint32_t *)
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,(ulong)uVar25);
  if (((int)puVar13 - (int)puVar15 & 3U) != 0) {
    __assert_fail("((code_end - code_start) % 4) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                  ,0xf3,
                  "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                 );
  }
  LinkedObjectFile::set_segment_count(local_c0,1);
  for (; puVar15 < puVar13; puVar15 = puVar15 + 1) {
    LinkedObjectFile::push_back_word_to_segment(local_c0,*puVar15,0);
  }
  piVar11 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             (data,(ulong)uVar25);
  if (*piVar11 != -1) {
    __assert_fail("link_header_v2->type_tag == 0xffffffff",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                  ,0xfc,
                  "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                 );
  }
  if (piVar11[2] != 2) {
    __assert_fail("link_header_v2->version == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                  ,0xfd,
                  "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                 );
  }
  if (piVar11[1] != *(int *)(local_b0 + 4)) {
    __assert_fail("link_header_v2->length == header->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                  ,0xfe,
                  "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                 );
  }
  puVar15 = &(local_c0->stats).total_v2_link_bytes;
  *puVar15 = *puVar15 + piVar11[1];
  sVar32 = (size_type)(iVar34 + 0x1c);
  pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,sVar32);
  local_a8 = piVar11;
  if (*pvVar12 != '\0') {
    uVar25 = 0x10;
    bVar8 = false;
    do {
      iVar34 = (int)sVar32;
      pbVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,sVar32);
      bVar4 = *pbVar16;
      bVar35 = bVar4;
      if (bVar8) {
        while (bVar35 != 0) {
          piVar11 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                     (local_b8,(ulong)uVar25);
          bVar9 = LinkedObjectFile::pointer_link_word(local_c0,0,uVar25 - 0x10,0,*piVar11);
          if (!bVar9) {
            printf("WARNING bad link in %s\n",(local_90->_M_dataplus)._M_p);
          }
          puVar15 = &(local_c0->stats).total_v2_pointers;
          *puVar15 = *puVar15 + 1;
          uVar25 = uVar25 + 4;
          bVar35 = bVar35 - 1;
        }
      }
      else {
        uVar25 = uVar25 + (uint)bVar4 * 4;
        puVar15 = &(local_c0->stats).total_v2_pointer_seeks;
        *puVar15 = *puVar15 + 1;
      }
      data = local_b8;
      uVar31 = iVar34 + 1;
      if (bVar4 == 0xff) {
        pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            (local_b8,(ulong)uVar31);
        bVar9 = *pvVar12 == '\0';
        if (bVar9) {
          uVar31 = iVar34 + 2;
        }
      }
      else {
        pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            (local_b8,(ulong)uVar31);
        bVar9 = true;
        if (*pvVar12 == '\0') goto LAB_00138a9c;
      }
      bVar8 = (bool)(bVar8 ^ bVar9);
      sVar32 = (size_type)uVar31;
    } while( true );
  }
  uVar25 = iVar34 + 0x1d;
LAB_00138f7f:
  uVar28 = (ulong)uVar25;
  pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,uVar28);
  if (*pvVar12 != '\0') {
    do {
      uVar25 = (uint)uVar28;
      pbVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,uVar28);
      bVar4 = *pbVar16;
      if ((char)bVar4 < '\0') {
        uVar25 = uVar25 + 1;
        pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            (local_b8,(ulong)uVar25);
        if ((bVar4 & 0x7f) != 0) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                        ,0x15f,
                        "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                       );
        }
        SVar29 = TYPE;
      }
      else {
        if (bVar4 < 10) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                        ,0x14c,
                        "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                       );
        }
        pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(local_b8,uVar28);
        SVar29 = SYMBOL;
      }
      std::__cxx11::string::string((string *)&local_50,"_empty_",(allocator *)segment_data_offsets);
      bVar8 = std::operator==(&local_50,(char *)pvVar12);
      std::__cxx11::string::~string((string *)&local_50);
      if (((char)bVar4 < '\0') && (bVar8)) {
        __assert_fail("kind == SymbolLinkKind::SYMBOL",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x164,
                      "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                     );
      }
      if (bVar8) {
        SVar29 = EMPTY_LIST;
      }
      sVar19 = strlen((char *)pvVar12);
      puVar15 = &(local_c0->stats).total_v2_symbol_count;
      *puVar15 = *puVar15 + 1;
      uVar10 = c_symlink2(local_c0,local_b8,0x10,uVar25 + (int)sVar19 + 1,SVar29,(char *)pvVar12,0);
      uVar28 = (ulong)uVar10;
      pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                          (local_b8,(ulong)uVar10);
      data = local_b8;
    } while (*pvVar12 != '\0');
  }
  if (local_a8[1] != ((int)uVar28 - (int)local_98 & 0xffffffc0U) + 0x40) {
    __assert_fail("link_header_v2->length == align64(link_ptr_offset - link_data_offset + 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                  ,0x171,
                  "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                 );
  }
  do {
    if ((ulong)((long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start) <= uVar28) {
      return local_c0;
    }
    pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,uVar28);
    uVar28 = (ulong)((int)uVar28 + 1);
  } while (*pvVar12 == '\0');
  __assert_fail("data.at(link_ptr_offset) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                ,0x173,
                "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
               );
LAB_00138a9c:
  uVar25 = iVar34 + 2;
  goto LAB_00138f7f;
}

Assistant:

LinkedObjectFile to_linked_object_file(const std::vector<uint8_t>& data, const std::string& name) {
  LinkedObjectFile result;
  const auto* header = (const LinkHeaderCommon*)&data.at(0);

  // use appropriate linker
  if (header->version == 3) {
    assert(header->type_tag == 0);
    link_v3(result, data, name);
  } else if (header->version == 4) {
    assert(header->type_tag == 0xffffffff);
    link_v4(result, data, name);
  } else if (header->version == 5) {
    link_v5(result, data, name);
  } else {
    assert(false);
  }

  return result;
}